

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[31]>(XmlWriter *this,string *name,char (*attribute) [31])

{
  ReusableStringStream rss;
  ReusableStringStream RStack_58;
  string local_40;
  
  ReusableStringStream::ReusableStringStream(&RStack_58);
  std::operator<<(RStack_58.m_oss,*attribute);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ReusableStringStream::~ReusableStringStream(&RStack_58);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }